

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::BloomFilterPolicy::CreateFilter
          (BloomFilterPolicy *this,Slice *keys,int n,string *dst)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uStack_60;
  uint32_t bitpos;
  size_t j;
  uint local_50;
  uint32_t delta;
  uint32_t h;
  int i;
  char *array;
  size_t init_size;
  size_t bytes;
  size_t bits;
  string *dst_local;
  int n_local;
  Slice *keys_local;
  BloomFilterPolicy *this_local;
  
  bytes = (long)n * this->bits_per_key_;
  if (bytes < 0x40) {
    bytes = 0x40;
  }
  uVar4 = bytes + 7 >> 3;
  cVar2 = std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)dst,cVar2 + (char)uVar4);
  std::__cxx11::string::push_back((char)dst);
  lVar5 = std::__cxx11::string::operator[]((ulong)dst);
  for (delta = 0; (int)delta < n; delta = delta + 1) {
    local_50 = BloomHash(keys + (int)delta);
    uVar3 = local_50 >> 0x11;
    uVar6 = local_50 << 0xf;
    for (uStack_60 = 0; uStack_60 < this->k_; uStack_60 = uStack_60 + 1) {
      uVar1 = (ulong)local_50 % (uVar4 << 3);
      uVar7 = uVar1 >> 3 & 0x1fffffff;
      *(byte *)(lVar5 + uVar7) = *(byte *)(lVar5 + uVar7) | (byte)(1 << ((byte)uVar1 & 7));
      local_50 = (uVar3 | uVar6) + local_50;
    }
  }
  return;
}

Assistant:

void CreateFilter(const Slice* keys, int n, std::string* dst) const override {
    // Compute bloom filter size (in both bits and bytes)
    size_t bits = n * bits_per_key_;

    // For small n, we can see a very high false positive rate.  Fix it
    // by enforcing a minimum bloom filter length.
    if (bits < 64) bits = 64;

    size_t bytes = (bits + 7) / 8;
    bits = bytes * 8;

    const size_t init_size = dst->size();
    dst->resize(init_size + bytes, 0);
    dst->push_back(static_cast<char>(k_));  // Remember # of probes in filter
    char* array = &(*dst)[init_size];
    for (int i = 0; i < n; i++) {
      // Use double-hashing to generate a sequence of hash values.
      // See analysis in [Kirsch,Mitzenmacher 2006].
      uint32_t h = BloomHash(keys[i]);
      const uint32_t delta = (h >> 17) | (h << 15);  // Rotate right 17 bits
      for (size_t j = 0; j < k_; j++) {
        const uint32_t bitpos = h % bits;
        array[bitpos / 8] |= (1 << (bitpos % 8));
        h += delta;
      }
    }
  }